

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<const_pbrt::RGBColorSpace_*> * __thiscall
pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
          (optional<const_pbrt::RGBColorSpace_*> *this,optional<const_pbrt::RGBColorSpace_*> *v)

{
  bool bVar1;
  optional<const_pbrt::RGBColorSpace_*> *this_00;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  *paVar2;
  optional<const_pbrt::RGBColorSpace_*> *in_RSI;
  optional<const_pbrt::RGBColorSpace_*> *in_RDI;
  optional<const_pbrt::RGBColorSpace_*> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<const_pbrt::RGBColorSpace_*> *)
              ptr((optional<const_pbrt::RGBColorSpace_*> *)0x8c8ee7);
    paVar2 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              *)value(this_00);
    this_00->optionalValue = *paVar2;
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }